

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkaccessmanager.cpp
# Opt level: O1

void QNetworkAccessManager::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  offset_in_QNetworkAccessManager_to_subr *candidate;
  undefined8 *puVar2;
  undefined4 uVar3;
  InterfaceType *pIVar4;
  int iVar5;
  long in_FS_OFFSET;
  undefined8 local_48;
  undefined8 local_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == RegisterMethodArgumentMetaType) {
    switch(_id) {
    case 4:
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 1) {
LAB_00182688:
        pIVar4 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QSslError>_>::metaType;
LAB_001826b2:
        *puVar2 = pIVar4;
        goto LAB_00182760;
      }
      break;
    case 5:
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 1) {
LAB_001826ab:
        pIVar4 = &QtPrivate::QMetaTypeInterfaceWrapper<QSslPreSharedKeyAuthenticator_*>::metaType;
        goto LAB_001826b2;
      }
      break;
    default:
      puVar2 = (undefined8 *)*_a;
      break;
    case 7:
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) goto LAB_00182688;
      break;
    case 8:
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) goto LAB_001826ab;
    }
    *puVar2 = 0;
    goto LAB_00182760;
  }
  if (_c == IndexOfMethod) {
    plVar1 = (long *)_a[1];
    if (((((code *)*plVar1 == proxyAuthenticationRequired) && (uVar3 = 0, plVar1[1] == 0)) ||
        (((code *)*plVar1 == authenticationRequired && (uVar3 = 1, plVar1[1] == 0)))) ||
       (((((code *)*plVar1 == finished && (uVar3 = 2, plVar1[1] == 0)) ||
         (((code *)*plVar1 == encrypted && (uVar3 = 3, plVar1[1] == 0)))) ||
        ((((code *)*plVar1 == sslErrors && (uVar3 = 4, plVar1[1] == 0)) ||
         (((code *)*plVar1 == preSharedKeyAuthenticationRequired && (uVar3 = 5, plVar1[1] == 0))))))
       )) {
      *(undefined4 *)*_a = uVar3;
    }
    goto LAB_00182760;
  }
  if (_c != InvokeMetaMethod) goto LAB_00182760;
  switch(_id) {
  case 0:
    puStack_30 = (undefined1 *)_a[1];
    local_40 = *_a[2];
    local_28 = (undefined1 *)&local_40;
    iVar5 = 0;
    break;
  case 1:
    local_40 = *_a[1];
    local_48 = *_a[2];
    puStack_30 = (undefined1 *)&local_40;
    iVar5 = 1;
    local_28 = (undefined1 *)&local_48;
    break;
  case 2:
    local_40 = *_a[1];
    puStack_30 = (undefined1 *)&local_40;
    iVar5 = 2;
    break;
  case 3:
    local_40 = *_a[1];
    puStack_30 = (undefined1 *)&local_40;
    iVar5 = 3;
    break;
  case 4:
    local_40 = *_a[1];
    puStack_30 = (undefined1 *)&local_40;
    iVar5 = 4;
    local_28 = (undefined1 *)_a[2];
    break;
  case 5:
    local_40 = *_a[1];
    local_48 = *_a[2];
    puStack_30 = (undefined1 *)&local_40;
    iVar5 = 5;
    local_28 = (undefined1 *)&local_48;
    break;
  case 6:
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    supportedSchemesImplementation((QStringList *)&local_38,(QNetworkAccessManager *)_o);
    if ((QArrayDataPointer<QString> *)*_a != (QArrayDataPointer<QString> *)0x0) {
      QArrayDataPointer<QString>::operator=
                ((QArrayDataPointer<QString> *)*_a,(QArrayDataPointer<QString> *)&local_38);
    }
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_38);
    goto LAB_00182760;
  case 7:
    QNetworkAccessManagerPrivate::_q_replySslErrors
              (*(QNetworkAccessManagerPrivate **)(_o + 8),(QList<QSslError> *)_a[1]);
    goto LAB_00182760;
  case 8:
    QNetworkAccessManagerPrivate::_q_replyPreSharedKeyAuthenticationRequired
              (*(QNetworkAccessManagerPrivate **)(_o + 8),*_a[1]);
  default:
    goto LAB_00182760;
  }
  local_38 = (undefined1 *)0x0;
  QMetaObject::activate(_o,&staticMetaObject,iVar5,&local_38);
LAB_00182760:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkAccessManager::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QNetworkAccessManager *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->proxyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QNetworkProxy>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 1: _t->authenticationRequired((*reinterpret_cast< std::add_pointer_t<QNetworkReply*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 2: _t->finished((*reinterpret_cast< std::add_pointer_t<QNetworkReply*>>(_a[1]))); break;
        case 3: _t->encrypted((*reinterpret_cast< std::add_pointer_t<QNetworkReply*>>(_a[1]))); break;
        case 4: _t->sslErrors((*reinterpret_cast< std::add_pointer_t<QNetworkReply*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[2]))); break;
        case 5: _t->preSharedKeyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QNetworkReply*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[2]))); break;
        case 6: { QStringList _r = _t->supportedSchemesImplementation();
            if (_a[0]) *reinterpret_cast< QStringList*>(_a[0]) = std::move(_r); }  break;
        case 7: _t->d_func()->_q_replySslErrors((*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[1]))); break;
        case 8: _t->d_func()->_q_replyPreSharedKeyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            }
            break;
        case 5:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslPreSharedKeyAuthenticator* >(); break;
            }
            break;
        case 7:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            }
            break;
        case 8:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslPreSharedKeyAuthenticator* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QNetworkAccessManager::*)(const QNetworkProxy & , QAuthenticator * )>(_a, &QNetworkAccessManager::proxyAuthenticationRequired, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkAccessManager::*)(QNetworkReply * , QAuthenticator * )>(_a, &QNetworkAccessManager::authenticationRequired, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkAccessManager::*)(QNetworkReply * )>(_a, &QNetworkAccessManager::finished, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkAccessManager::*)(QNetworkReply * )>(_a, &QNetworkAccessManager::encrypted, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkAccessManager::*)(QNetworkReply * , const QList<QSslError> & )>(_a, &QNetworkAccessManager::sslErrors, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkAccessManager::*)(QNetworkReply * , QSslPreSharedKeyAuthenticator * )>(_a, &QNetworkAccessManager::preSharedKeyAuthenticationRequired, 5))
            return;
    }
}